

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeDamped.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeDamped::FluctuatingChargeDamped
          (FluctuatingChargeDamped *this,SimInfo *info)

{
  FluctuatingChargePropagator::FluctuatingChargePropagator
            (&this->super_FluctuatingChargePropagator,info);
  (this->super_FluctuatingChargePropagator)._vptr_FluctuatingChargePropagator =
       (_func_int **)&PTR__FluctuatingChargePropagator_00302090;
  *(undefined4 *)&(this->super_FluctuatingChargePropagator).field_0x2c = 4;
  this->forceTolerance_ = 1e-06;
  this->snap = info->sman_->currentSnapshot_;
  return;
}

Assistant:

FluctuatingChargeDamped::FluctuatingChargeDamped(SimInfo* info) :
      FluctuatingChargePropagator(info), maxIterNum_(4), forceTolerance_(1e-6),
      snap(info->getSnapshotManager()->getCurrentSnapshot()) {}